

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_doing(Curl_easy *data,_Bool *dophase_done)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  
  CVar2 = smtp_multi_statemach(data,dophase_done);
  if (CVar2 == CURLE_OK) {
    CVar2 = CURLE_OK;
    if ((*dophase_done == true) && (((data->req).p.imap)->transfer != PPTRANSFER_BODY)) {
      Curl_xfer_setup_nop(data);
      CVar2 = CURLE_OK;
    }
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_trc_feat_smtp.log_level)) {
    Curl_trc_smtp(data,"smtp_doing() -> %d, done=%d",(ulong)CVar2,(ulong)*dophase_done);
  }
  return CVar2;
}

Assistant:

static CURLcode smtp_doing(struct Curl_easy *data, bool *dophase_done)
{
  CURLcode result = smtp_multi_statemach(data, dophase_done);

  if(result)
    DEBUGF(infof(data, "DO phase failed"));
  else if(*dophase_done) {
    result = smtp_dophase_done(data, FALSE /* not connected */);

    DEBUGF(infof(data, "DO phase is complete"));
  }

  CURL_TRC_SMTP(data, "smtp_doing() -> %d, done=%d", result, *dophase_done);
  return result;
}